

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_shared_reference.cpp
# Opt level: O3

void lower_shared_reference(gl_context *ctx,gl_shader_program *prog,gl_linked_shader *shader)

{
  lower_shared_reference_visitor v;
  ir_hierarchical_visitor local_88;
  void *local_50;
  gl_linked_shader *local_48;
  undefined8 ***local_40;
  undefined8 ***local_38;
  uint local_30;
  char local_2c;
  
  if (shader->Stage == MESA_SHADER_COMPUTE) {
    ir_hierarchical_visitor::ir_hierarchical_visitor(&local_88);
    local_88._vptr_ir_hierarchical_visitor = (_func_int **)&PTR_visit_00256f10;
    local_50 = ralloc_context((void *)0x0);
    local_30 = 0;
    local_40 = &local_40;
    local_48 = shader;
    local_38 = local_40;
    do {
      local_2c = '\0';
      visit_list_elements(&local_88,shader->ir,true);
    } while (local_2c != '\0');
    (prog->Comp).SharedSize = local_30;
    if ((ctx->Const).MaxComputeSharedMemorySize < local_30) {
      linker_error(prog,"Too much shared memory used (%u/%u)\n");
    }
    local_88._vptr_ir_hierarchical_visitor = (_func_int **)&PTR_visit_00256f10;
    ralloc_free(local_50);
  }
  return;
}

Assistant:

void
lower_shared_reference(struct gl_context *ctx,
                       struct gl_shader_program *prog,
                       struct gl_linked_shader *shader)
{
   if (shader->Stage != MESA_SHADER_COMPUTE)
      return;

   lower_shared_reference_visitor v(shader);

   /* Loop over the instructions lowering references, because we take a deref
    * of an shared variable array using a shared variable dereference as the
    * index will produce a collection of instructions all of which have cloned
    * shared variable dereferences for that array index.
    */
   do {
      v.progress = false;
      visit_list_elements(&v, shader->ir);
   } while (v.progress);

   prog->Comp.SharedSize = v.shared_size;

   /* Section 19.1 (Compute Shader Variables) of the OpenGL 4.5 (Core Profile)
    * specification says:
    *
    *   "There is a limit to the total size of all variables declared as
    *    shared in a single program object. This limit, expressed in units of
    *    basic machine units, may be queried as the value of
    *    MAX_COMPUTE_SHARED_MEMORY_SIZE."
    */
   if (prog->Comp.SharedSize > ctx->Const.MaxComputeSharedMemorySize) {
      linker_error(prog, "Too much shared memory used (%u/%u)\n",
                   prog->Comp.SharedSize,
                   ctx->Const.MaxComputeSharedMemorySize);
   }
}